

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm_x86::forward_int8
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  int iVar2;
  pointer pMVar3;
  Mat *pMVar4;
  Mat *A;
  void *pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  float fVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  size_t sVar30;
  int iVar31;
  int *piVar32;
  uint uVar33;
  int iVar34;
  bool bVar35;
  uint local_36c;
  int local_368;
  float B_int8_scale;
  int TILE_K;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  Mat m_3;
  Mat m_1;
  Mat local_268;
  Mat *local_218;
  int local_20c;
  Mat m;
  Mat local_1b8;
  Mat local_168;
  Mat m_2;
  float B_int8_scale_1;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  int TILE_K_2;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  iVar2 = (this->super_Gemm).constantA;
  iVar22 = (this->super_Gemm).constantB;
  if (iVar22 != 0 && iVar2 != 0) {
    uVar26 = (this->super_Gemm).constantM;
LAB_0042c9f3:
    uVar23 = (this->super_Gemm).constantN;
  }
  else {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar2 == 0) {
      iVar13 = (this->super_Gemm).transA;
      if (iVar22 != 0) {
        if (iVar13 == 0) {
          uVar26 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
        }
        else {
          uVar26 = pMVar3->w;
        }
        goto LAB_0042c9f3;
      }
      if (iVar13 == 0) {
        uVar26 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
      }
      else {
        uVar26 = pMVar3->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar23 = pMVar3[1].w;
      }
      else {
        uVar23 = pMVar3[1].elempack * (&pMVar3[1].h)[(ulong)(pMVar3[1].dims == 3) * 2];
      }
    }
    else {
      uVar26 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar23 = pMVar3->w;
      }
      else {
        uVar23 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
      }
    }
  }
  local_268.dims = 0;
  local_268.w = 0;
  local_268.h = 0;
  local_268.d = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar3;
    if (iVar22 != 0 && iVar2 != 0) {
      bVar35 = true;
      if (lVar20 == 0x48) {
        local_268.data = pMVar3->data;
        piVar32 = pMVar3->refcount;
        sVar30 = pMVar3->elemsize;
        local_268.elempack = pMVar3->elempack;
        local_268.allocator = pMVar3->allocator;
        local_268.dims = pMVar3->dims;
        local_268.w = pMVar3->w;
        local_268.h = pMVar3->h;
        local_268.d = pMVar3->d;
        local_268.c = pMVar3->c;
        local_268.cstep = pMVar3->cstep;
        if (piVar32 == (int *)0x0) {
          piVar32 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          bVar35 = false;
        }
      }
      else {
        local_268.allocator = (Allocator *)0x0;
        local_268.elempack = 0;
        sVar30 = 0;
        piVar32 = (int *)0x0;
        local_268.data = (void *)0x0;
        local_268.c = 0;
        local_268.cstep = 0;
      }
      local_268.refcount._0_4_ = SUB84(piVar32,0);
      local_268.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      local_268.elemsize._0_4_ = (undefined4)sVar30;
      local_268.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      if (!bVar35) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_268.allocator == (Allocator *)0x0) goto LAB_0042e8db;
          (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator);
        }
      }
    }
    else if (iVar2 == 0) {
      if (iVar22 == 0) {
        bVar35 = true;
        if (lVar20 == 0xd8) {
          local_268.data = pMVar3[2].data;
          piVar32 = pMVar3[2].refcount;
          sVar30 = pMVar3[2].elemsize;
          local_268.elempack = pMVar3[2].elempack;
          local_268.allocator = pMVar3[2].allocator;
          local_268.dims = pMVar3[2].dims;
          local_268.w = pMVar3[2].w;
          local_268.h = pMVar3[2].h;
          local_268.d = pMVar3[2].d;
          local_268.c = pMVar3[2].c;
          local_268.cstep = pMVar3[2].cstep;
          if (piVar32 == (int *)0x0) {
            piVar32 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            bVar35 = false;
          }
        }
        else {
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.allocator = (Allocator *)0x0;
          local_268.elempack = 0;
          sVar30 = 0;
          piVar32 = (int *)0x0;
          local_268.data = (void *)0x0;
        }
        local_268.refcount._0_4_ = SUB84(piVar32,0);
        local_268.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        local_268.elemsize._0_4_ = (undefined4)sVar30;
        local_268.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
        if (!bVar35) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_268.allocator == (Allocator *)0x0) goto LAB_0042e8db;
            (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator);
          }
        }
      }
      else {
        bVar35 = true;
        if (lVar20 == 0x90) {
          local_268.data = pMVar3[1].data;
          piVar32 = pMVar3[1].refcount;
          sVar30 = pMVar3[1].elemsize;
          local_268.elempack = pMVar3[1].elempack;
          local_268.allocator = pMVar3[1].allocator;
          local_268.dims = pMVar3[1].dims;
          local_268.w = pMVar3[1].w;
          local_268.h = pMVar3[1].h;
          local_268.d = pMVar3[1].d;
          local_268.c = pMVar3[1].c;
          local_268.cstep = pMVar3[1].cstep;
          if (piVar32 == (int *)0x0) {
            piVar32 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
            bVar35 = false;
          }
        }
        else {
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.allocator = (Allocator *)0x0;
          local_268.elempack = 0;
          sVar30 = 0;
          piVar32 = (int *)0x0;
          local_268.data = (void *)0x0;
        }
        local_268.refcount._0_4_ = SUB84(piVar32,0);
        local_268.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
        local_268.elemsize._0_4_ = (undefined4)sVar30;
        local_268.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
        if (!bVar35) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_268.allocator == (Allocator *)0x0) {
LAB_0042e8db:
              free(local_268.data);
            }
            else {
              (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator);
            }
          }
        }
      }
    }
    else {
      bVar35 = true;
      if (lVar20 == 0x90) {
        local_268.data = pMVar3[1].data;
        piVar32 = pMVar3[1].refcount;
        sVar30 = pMVar3[1].elemsize;
        local_268.elempack = pMVar3[1].elempack;
        local_268.allocator = pMVar3[1].allocator;
        local_268.dims = pMVar3[1].dims;
        local_268.w = pMVar3[1].w;
        local_268.h = pMVar3[1].h;
        local_268.d = pMVar3[1].d;
        local_268.c = pMVar3[1].c;
        local_268.cstep = pMVar3[1].cstep;
        if (piVar32 == (int *)0x0) {
          piVar32 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          LOCK();
          *piVar32 = *piVar32 + 1;
          UNLOCK();
          bVar35 = false;
        }
      }
      else {
        local_268.cstep = 0;
        local_268.c = 0;
        local_268.allocator = (Allocator *)0x0;
        local_268.elempack = 0;
        sVar30 = 0;
        piVar32 = (int *)0x0;
        local_268.data = (void *)0x0;
      }
      local_268.refcount._0_4_ = SUB84(piVar32,0);
      local_268.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
      local_268.elemsize._0_4_ = (undefined4)sVar30;
      local_268.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      if (!bVar35) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_268.allocator == (Allocator *)0x0) goto LAB_0042e8db;
          (*(local_268.allocator)->_vptr_Allocator[3])(local_268.allocator);
        }
      }
    }
    local_36c = 0;
    if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0)) {
      if (local_268.dims == 1) {
        local_36c = (uint)(local_268.w * local_268.elempack == uVar26);
        bVar35 = local_268.w * local_268.elempack == uVar23;
      }
      else {
        bVar35 = local_268.dims != 2;
        local_36c = 0;
        if (local_268.w == 1U && !bVar35) {
          local_36c = (uint)(local_268.elempack * local_268.h == uVar26) * 2;
        }
        if (((local_268.w != 1U || bVar35) && bVar35) || (local_268.w != uVar23)) goto LAB_0042cd6a;
        if (local_268.elempack * local_268.h == uVar26) {
          local_36c = 3;
        }
        bVar35 = local_268.elempack * local_268.h == 1;
      }
      if (bVar35) {
        local_36c = 4;
      }
    }
  }
  else {
    piVar32 = (this->CT_data).refcount;
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + 1;
      UNLOCK();
    }
    local_268.data = (this->CT_data).data;
    piVar32 = (this->CT_data).refcount;
    local_268.refcount._0_4_ = SUB84(piVar32,0);
    local_268.refcount._4_4_ = (undefined4)((ulong)piVar32 >> 0x20);
    sVar30 = (this->CT_data).elemsize;
    local_268.elemsize._0_4_ = (undefined4)sVar30;
    local_268.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
    local_268.elempack = (this->CT_data).elempack;
    local_268.allocator = (this->CT_data).allocator;
    uVar6 = (this->CT_data).dims;
    uVar7 = (this->CT_data).w;
    uVar8 = (this->CT_data).h;
    uVar9 = (this->CT_data).d;
    local_268.c = (this->CT_data).c;
    local_268.cstep = (this->CT_data).cstep;
    local_36c = (this->super_Gemm).constant_broadcast_type_C;
    local_268.dims = uVar6;
    local_268.w = uVar7;
    local_268.h = uVar8;
    local_268.d = uVar9;
  }
LAB_0042cd6a:
  iVar2 = (this->super_Gemm).output_transpose;
  if (opt->use_packing_layout == true) {
    uVar33 = uVar23;
    if (iVar2 == 0) {
      uVar33 = uVar26;
    }
    iVar22 = (uint)((uVar33 & 3) == 0) * 3 + 1;
  }
  else {
    iVar22 = 1;
  }
  iVar13 = (this->super_Gemm).output_elempack;
  if (iVar13 != 0) {
    iVar22 = iVar13;
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar33 = uVar23;
  if (iVar2 != 0) {
    uVar33 = uVar26;
    uVar26 = uVar23;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(pMVar4,uVar33,(int)uVar26 / iVar22,(ulong)(uint)(iVar22 * 4),iVar22,
                opt->blob_allocator);
  }
  else {
    Mat::create(pMVar4,uVar33,1,(int)uVar26 / iVar22,(ulong)(uint)(iVar22 * 4),iVar22,
                opt->blob_allocator);
  }
  local_368 = -100;
  if ((pMVar4->data == (void *)0x0) || ((long)pMVar4->c * pMVar4->cstep == 0)) goto LAB_0042f7f9;
  iVar2 = *(int *)&(this->super_Gemm).field_0x244;
  iVar22 = iVar2;
  if (iVar2 == 0) {
    iVar22 = opt->num_threads;
  }
  if (opt->num_threads != iVar2 && iVar2 != 0) {
    fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d");
    fputc(10,_stderr);
  }
  iVar2 = (this->super_Gemm).constantA;
  iVar13 = (this->super_Gemm).constantB;
  if (iVar13 == 0 || iVar2 == 0) {
    A = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
    if (iVar2 == 0) {
      if (iVar13 == 0) {
        iVar2 = (this->super_Gemm).transA;
        iVar13 = (this->super_Gemm).transB;
        if (iVar2 == 0) {
          iVar28 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
          iVar29 = A->w;
        }
        else {
          iVar28 = A->w;
          iVar29 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
        }
        if (iVar13 == 0) {
          uVar26 = A[1].w;
        }
        else {
          uVar26 = A[1].elempack * (&A[1].h)[(ulong)(A[1].dims == 3) * 2];
        }
        iVar16 = (this->super_Gemm).output_transpose;
        fVar1 = (this->super_Gemm).alpha;
        fVar17 = (this->super_Gemm).beta;
        get_optimal_tile_mnk_int8
                  (iVar28,uVar26,iVar29,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_K,
                   (int *)&B_int8_scale,&TILE_K_2,iVar22);
        local_330 = (ulong)(uint)TILE_K;
        iVar24 = (iVar28 + TILE_K + -1) / TILE_K;
        iVar31 = (int)(uVar26 + (int)B_int8_scale + -1) / (int)B_int8_scale;
        uVar27 = (ulong)(uint)TILE_K_2;
        iVar34 = (TILE_K_2 + iVar29 + -1) / TILE_K_2;
        local_1b8.cstep = 0;
        local_1b8.data = (void *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        local_320 = (ulong)uVar26;
        local_218 = pMVar4;
        if (TILE_K_2 < 4) {
LAB_0042e255:
          Mat::create(&local_1b8,TILE_K_2 * (int)(float)local_330,iVar34,iVar22,1,
                      opt->workspace_allocator);
        }
        else {
          iVar25 = cpu_support_x86_avx512_vnni();
          bVar35 = true;
          if (iVar25 == 0) {
            iVar25 = cpu_support_x86_avx_vnni();
            bVar35 = iVar25 != 0;
          }
          iVar25 = cpu_support_x86_avx_vnni_int8();
          if (!(bool)(bVar35 & iVar25 == 0)) goto LAB_0042e255;
          iVar25 = (int)local_330;
          if (iVar25 < 0x10) {
            if (iVar25 < 8) {
              if (iVar25 < 4) {
                iVar10 = (uint)(1 < iVar25) * 4 + 4;
              }
              else {
                iVar10 = 0x10;
              }
            }
            else {
              iVar10 = 0x20;
            }
          }
          else {
            iVar10 = 0x40;
          }
          Mat::create(&local_1b8,(iVar10 + TILE_K_2) * iVar25,iVar34,iVar22,1,
                      opt->workspace_allocator);
        }
        local_368 = -100;
        if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
          local_168.cstep = 0;
          local_168.data = (void *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          Mat::create(&local_168,TILE_K_2 * (int)B_int8_scale,iVar34,iVar31,1,
                      opt->workspace_allocator);
          local_368 = -100;
          if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            Mat::create(&m_3,iVar28,4,opt->workspace_allocator);
            local_368 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              pMVar4 = A + 1;
              compute_B_int8_scale(pMVar4,&B_int8_scale_1);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,iVar28,4,opt->workspace_allocator);
              fVar15 = B_int8_scale_1;
              local_368 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                iVar31 = iVar34 * iVar31;
                iVar28 = 0;
                if (iVar31 < 1) {
                  iVar31 = 0;
                }
                for (; iVar31 != iVar28; iVar28 = iVar28 + 1) {
                  iVar25 = (iVar28 / iVar34) * (int)B_int8_scale;
                  iVar10 = (int)((long)iVar28 % (long)iVar34) * TILE_K_2;
                  fVar14 = (float)((int)local_320 - iVar25);
                  if ((int)B_int8_scale < (int)fVar14) {
                    fVar14 = B_int8_scale;
                  }
                  iVar21 = iVar29 - iVar10;
                  if (TILE_K_2 < iVar29 - iVar10) {
                    iVar21 = TILE_K_2;
                  }
                  m_1.cstep = (size_t)local_168.w;
                  m_1.data = (void *)((long)local_168.data +
                                     ((long)iVar28 % (long)iVar34 & 0xffffffffU) * m_1.cstep *
                                     CONCAT44(local_168.elemsize._4_4_,
                                              (undefined4)local_168.elemsize) +
                                     (long)(iVar28 / iVar34) * local_168.cstep *
                                     CONCAT44(local_168.elemsize._4_4_,
                                              (undefined4)local_168.elemsize));
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)local_168.elemsize;
                  m_1.elemsize._4_4_ = local_168.elemsize._4_4_;
                  m_1.elempack = local_168.elempack;
                  m_1.allocator = local_168.allocator;
                  m_1.dims = 2;
                  m_1.w = local_168.w;
                  m_1.h = 1;
                  m_1.d = 1;
                  m_1.c = 1;
                  if (iVar13 == 0) {
                    transpose_pack_B_tile_quantize
                              (pMVar4,&m_1,iVar25,(int)fVar14,iVar10,iVar21,fVar15);
                  }
                  else {
                    pack_B_tile_quantize(pMVar4,&m_1,iVar25,(int)fVar14,iVar10,iVar21,fVar15);
                  }
                }
                m_1.cstep = 0;
                m_1.data = (void *)0x0;
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = 0;
                m_1.elemsize._4_4_ = 0;
                m_1.elempack = 0;
                m_1.allocator = (Allocator *)0x0;
                m_1.dims = 0;
                m_1.w = 0;
                m_1.h = 0;
                m_1.d = 0;
                m_1.c = 0;
                Mat::create(&m_1,(int)B_int8_scale * (int)(float)local_330,1,iVar22,4,
                            opt->workspace_allocator);
                local_368 = -100;
                if ((m_1.data != (void *)0x0) && ((long)m_1.c * m_1.cstep != 0)) {
                  local_368 = 0;
                  if (iVar24 < 1) {
                    iVar24 = 0;
                  }
                  local_328 = uVar27;
                  for (iVar22 = 0; iVar22 != iVar24; iVar22 = iVar22 + 1) {
                    if (iVar2 == 0) {
                      iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                      iVar28 = A->w;
                    }
                    else {
                      iVar13 = A->w;
                      iVar28 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    }
                    iVar31 = (int)local_330;
                    iVar34 = iVar22 * iVar31;
                    iVar29 = iVar13 - iVar34;
                    if (iVar31 < iVar13 - iVar34) {
                      iVar29 = iVar31;
                    }
                    iVar13 = get_omp_thread_num();
                    m_2.elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                    m_2.data = (void *)((long)iVar13 * m_1.cstep * m_2.elemsize + (long)m_1.data);
                    m_2.refcount = (int *)0x0;
                    m_2.elempack = m_1.elempack;
                    m_2.allocator = m_1.allocator;
                    m_2.w = m_1.w;
                    m_2.d = 1;
                    m_2.h = m_1.h;
                    m_2.c = m_1.d;
                    m_2.dims = m_1.dims + -1;
                    m_2.cstep = (m_2.elemsize * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0
                                ) / m_2.elemsize;
                    if (m_1.dims == 4) {
                      m_2.cstep = (long)m_1.h * (long)m_1.w;
                    }
                    for (iVar13 = 0; fVar15 = (float)((int)local_320 - iVar13),
                        fVar15 != 0.0 && iVar13 <= (int)local_320;
                        iVar13 = iVar13 + (int)B_int8_scale) {
                      if ((int)B_int8_scale < (int)fVar15) {
                        fVar15 = B_int8_scale;
                      }
                      iVar31 = iVar28;
                      for (iVar25 = 0; iVar25 < iVar28; iVar25 = iVar25 + (int)uVar27) {
                        iVar21 = (int)uVar27;
                        iVar10 = iVar31;
                        if (iVar21 < iVar31) {
                          iVar10 = iVar21;
                        }
                        iVar11 = get_omp_thread_num();
                        local_b8 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize)
                        ;
                        local_88 = (size_t)local_1b8.w;
                        _TILE_M = (void *)((long)local_1b8.data +
                                          local_b8 * local_88 * (long)(iVar25 / iVar21) +
                                          (long)iVar11 * local_1b8.cstep * local_b8);
                        local_c0 = (int *)0x0;
                        local_b0 = local_1b8.elempack;
                        local_a8 = local_1b8.allocator;
                        local_a0 = 2;
                        local_9c = local_1b8.w;
                        local_98._0_4_ = 1;
                        local_98._4_4_ = 1;
                        local_90 = 1;
                        local_68 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
                        ;
                        local_38 = (size_t)local_168.w;
                        _TILE_N = (void *)((long)local_168.data +
                                          local_38 * local_68 * (long)(iVar25 / iVar21) +
                                          (long)(iVar13 / (int)B_int8_scale) * local_168.cstep *
                                          local_68);
                        local_70 = (int *)0x0;
                        local_60 = local_168.elempack;
                        local_58 = local_168.allocator;
                        local_4c = local_168.w;
                        local_48._0_4_ = 1;
                        local_48._4_4_ = 1;
                        local_50 = local_a0;
                        local_40 = local_90;
                        if (iVar13 == 0) {
                          if (iVar25 == 0) {
                            if (iVar2 != 0) {
                              transpose_compute_A_tile_int8_scales
                                        (A,&m_3,B_int8_scale_1,&m,iVar34,iVar29);
                              goto LAB_0042ede9;
                            }
                            compute_A_tile_int8_scales(A,&m_3,B_int8_scale_1,&m,iVar34,iVar29);
                          }
                          else if (iVar2 != 0) {
LAB_0042ede9:
                            transpose_pack_A_tile_quantize
                                      (A,(Mat *)&TILE_M,iVar34,iVar29,iVar25,iVar10,&m_3);
                            uVar27 = local_328;
                            goto LAB_0042ee71;
                          }
                          pack_A_tile_quantize(A,(Mat *)&TILE_M,iVar34,iVar29,iVar25,iVar10,&m_3);
                          uVar27 = local_328;
                        }
LAB_0042ee71:
                        gemm_transB_packed_tile_int8
                                  ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar34,iVar29,iVar13,
                                   (int)fVar15,iVar25,iVar10);
                        if (local_70 != (int *)0x0) {
                          LOCK();
                          *local_70 = *local_70 + -1;
                          UNLOCK();
                          if (*local_70 == 0) {
                            if (local_58 == (Allocator *)0x0) {
                              free(_TILE_N);
                            }
                            else {
                              (*local_58->_vptr_Allocator[3])();
                            }
                          }
                        }
                        if (local_c0 != (int *)0x0) {
                          LOCK();
                          *local_c0 = *local_c0 + -1;
                          UNLOCK();
                          if (*local_c0 == 0) {
                            if (local_a8 == (Allocator *)0x0) {
                              free(_TILE_M);
                            }
                            else {
                              (*local_a8->_vptr_Allocator[3])();
                            }
                          }
                        }
                        iVar31 = iVar31 - (int)uVar27;
                      }
                      unpack_output_tile_dequantize
                                (&m_2,&local_268,local_218,local_36c,iVar34,iVar29,iVar13,
                                 (int)fVar15,&m,fVar1,fVar17,iVar16);
                    }
                    if (m_2.refcount != (int *)0x0) {
                      LOCK();
                      *m_2.refcount = *m_2.refcount + -1;
                      UNLOCK();
                      if (*m_2.refcount == 0) {
                        if (m_2.allocator == (Allocator *)0x0) {
                          free(m_2.data);
                        }
                        else {
                          (*(m_2.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                  }
                }
                piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar32 != (int *)0x0) {
                  LOCK();
                  *piVar32 = *piVar32 + -1;
                  UNLOCK();
                  if (*piVar32 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      free(m_1.data);
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar32 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                free(local_168.data);
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar32 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar32 == (int *)0x0) goto LAB_0042f7f9;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0042f7f9;
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0042f7f9;
        }
      }
      else {
        iVar2 = (this->super_Gemm).constantN;
        iVar13 = (this->super_Gemm).constantK;
        iVar28 = (this->super_Gemm).transA;
        local_328 = CONCAT44(local_328._4_4_,iVar28);
        if (iVar28 == 0) {
          iVar28 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
        }
        else {
          iVar28 = A->w;
        }
        local_320 = CONCAT44(local_320._4_4_,(this->super_Gemm).B_data_int8_scale);
        iVar29 = (this->super_Gemm).output_transpose;
        local_330 = CONCAT44(local_330._4_4_,(this->super_Gemm).alpha);
        fVar1 = (this->super_Gemm).beta;
        get_optimal_tile_mnk_int8
                  (iVar28,iVar2,iVar13,(this->super_Gemm).constant_TILE_M,
                   (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_N,
                   &TILE_K,(int *)&B_int8_scale,iVar22);
        iVar16 = TILE_N;
        local_20c = (iVar28 + TILE_N + -1) / TILE_N;
        local_1b8.cstep = 0;
        local_1b8.data = (void *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        Mat::create(&local_1b8,iVar28,4,opt->workspace_allocator);
        local_368 = -100;
        if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
          local_168.cstep = 0;
          local_168.data = (void *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          Mat::create(&local_168,iVar28,4,opt->workspace_allocator);
          local_368 = -100;
          if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            local_218 = pMVar4;
            if ((int)B_int8_scale < 4) {
LAB_0042e372:
              Mat::create(&m_3,(int)B_int8_scale * iVar16,
                          (iVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar22,1,
                          opt->workspace_allocator);
            }
            else {
              iVar28 = cpu_support_x86_avx512_vnni();
              bVar35 = true;
              if (iVar28 == 0) {
                iVar28 = cpu_support_x86_avx_vnni();
                bVar35 = iVar28 != 0;
              }
              iVar28 = cpu_support_x86_avx_vnni_int8();
              if (!(bool)(bVar35 & iVar28 == 0)) goto LAB_0042e372;
              if (iVar16 < 0x10) {
                if (iVar16 < 8) {
                  if (iVar16 < 4) {
                    iVar28 = (uint)(1 < iVar16) * 4 + 4;
                  }
                  else {
                    iVar28 = 0x10;
                  }
                }
                else {
                  iVar28 = 0x20;
                }
              }
              else {
                iVar28 = 0x40;
              }
              Mat::create(&m_3,(iVar28 + (int)B_int8_scale) * iVar16,
                          (iVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar22,1,
                          opt->workspace_allocator);
            }
            local_368 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,TILE_K * iVar16,1,iVar22,4,opt->workspace_allocator);
              local_368 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                local_368 = 0;
                if (local_20c < 1) {
                  local_20c = 0;
                }
                for (iVar22 = 0; iVar22 != local_20c; iVar22 = iVar22 + 1) {
                  if ((int)local_328 == 0) {
                    iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    fVar17 = (float)A->w;
                  }
                  else {
                    iVar13 = A->w;
                    fVar17 = (float)(A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2]);
                  }
                  iVar24 = iVar22 * iVar16;
                  iVar28 = iVar13 - iVar24;
                  if (iVar16 < iVar13 - iVar24) {
                    iVar28 = iVar16;
                  }
                  iVar13 = get_omp_thread_num();
                  uVar27 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.data = (void *)((long)iVar13 * m.cstep * uVar27 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar27 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar27;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  for (iVar13 = 0; iVar31 = iVar2 - iVar13, iVar31 != 0 && iVar13 <= iVar2;
                      iVar13 = iVar13 + TILE_K) {
                    if (TILE_K < iVar31) {
                      iVar31 = TILE_K;
                    }
                    fVar15 = fVar17;
                    for (iVar34 = 0; iVar34 < (int)fVar17; iVar34 = iVar34 + (int)B_int8_scale) {
                      fVar14 = fVar15;
                      if ((int)B_int8_scale < (int)fVar15) {
                        fVar14 = B_int8_scale;
                      }
                      iVar25 = get_omp_thread_num();
                      m_2.elemsize = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                      m_2.cstep = (size_t)m_3.w;
                      m_2.data = (void *)((long)m_3.data +
                                         m_2.elemsize * m_2.cstep *
                                         (long)(iVar34 / (int)B_int8_scale) +
                                         (long)iVar25 * m_3.cstep * m_2.elemsize);
                      m_2.refcount = (int *)0x0;
                      m_2.elempack = m_3.elempack;
                      m_2.allocator = m_3.allocator;
                      m_2.dims = 2;
                      m_2.w = m_3.w;
                      m_2.h = 1;
                      m_2.d = 1;
                      m_2.c = 1;
                      local_b8 = (this->BT_data).elemsize;
                      local_9c = (this->BT_data).w;
                      local_88 = (size_t)local_9c;
                      local_b0 = (this->BT_data).elempack;
                      local_a8 = (this->BT_data).allocator;
                      local_c0 = (int *)0x0;
                      _TILE_M = (void *)((long)(this->BT_data).data +
                                        local_88 * local_b8 * (long)(iVar34 / (int)B_int8_scale) +
                                        (long)(iVar13 / TILE_K) * (this->BT_data).cstep * local_b8);
                      local_98._0_4_ = 1;
                      local_98._4_4_ = 1;
                      local_a0 = m_2.dims;
                      local_90 = m_2.c;
                      if (iVar13 == 0) {
                        if (iVar34 == 0) {
                          if ((int)local_328 != 0) {
                            transpose_compute_A_tile_int8_scales
                                      (A,&local_1b8,(float)local_320,&local_168,iVar24,iVar28);
                            goto LAB_0042f456;
                          }
                          compute_A_tile_int8_scales
                                    (A,&local_1b8,(float)local_320,&local_168,iVar24,iVar28);
                        }
                        else if ((int)local_328 != 0) {
LAB_0042f456:
                          transpose_pack_A_tile_quantize
                                    (A,&m_2,iVar24,iVar28,iVar34,(int)fVar14,&local_1b8);
                          goto LAB_0042f4c7;
                        }
                        pack_A_tile_quantize(A,&m_2,iVar24,iVar28,iVar34,(int)fVar14,&local_1b8);
                      }
LAB_0042f4c7:
                      gemm_transB_packed_tile_int8
                                (&m_2,(Mat *)&TILE_M,&m_1,iVar24,iVar28,iVar13,iVar31,iVar34,
                                 (int)fVar14);
                      if (local_c0 != (int *)0x0) {
                        LOCK();
                        *local_c0 = *local_c0 + -1;
                        UNLOCK();
                        if (*local_c0 == 0) {
                          if (local_a8 == (Allocator *)0x0) {
                            free(_TILE_M);
                          }
                          else {
                            (*local_a8->_vptr_Allocator[3])();
                          }
                        }
                      }
                      if (m_2.refcount != (int *)0x0) {
                        LOCK();
                        *m_2.refcount = *m_2.refcount + -1;
                        UNLOCK();
                        if (*m_2.refcount == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            free(m_2.data);
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      fVar15 = (float)((int)fVar15 - (int)B_int8_scale);
                    }
                    unpack_output_tile_dequantize
                              (&m_1,&local_268,local_218,local_36c,iVar24,iVar28,iVar13,iVar31,
                               &local_168,(float)local_330,fVar1,iVar29);
                  }
                  piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar32 != (int *)0x0) {
              LOCK();
              *piVar32 = *piVar32 + -1;
              UNLOCK();
              if (*piVar32 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  free(m_3.data);
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar32 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                free(local_168.data);
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar32 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar32 == (int *)0x0) goto LAB_0042f7f9;
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 != 0) goto LAB_0042f7f9;
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          goto LAB_0042f7f9;
        }
      }
    }
    else {
      uVar26 = (this->super_Gemm).constantM;
      iVar2 = (this->super_Gemm).constantK;
      iVar13 = (this->super_Gemm).transB;
      if (iVar13 == 0) {
        iVar28 = A->w;
      }
      else {
        iVar28 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      local_328 = (ulong)(uint)(this->super_Gemm).output_transpose;
      local_320 = CONCAT44(local_320._4_4_,(this->super_Gemm).alpha);
      fVar1 = (this->super_Gemm).beta;
      local_218 = pMVar4;
      get_optimal_tile_mnk_int8
                (uVar26,iVar28,iVar2,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar22);
      iVar29 = TILE_M;
      uVar27 = (long)(int)(uVar26 + TILE_M + -1) / (long)TILE_M;
      uVar12 = uVar27 & 0xffffffff;
      iVar16 = TILE_N;
      iVar24 = (TILE_N + iVar28 + -1) / TILE_N;
      iVar31 = (iVar2 + TILE_K + -1) / TILE_K;
      local_1b8.cstep = 0;
      local_1b8.data = (void *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize._0_4_ = 0;
      local_1b8.elemsize._4_4_ = 0;
      local_1b8.elempack = 0;
      local_1b8.allocator = (Allocator *)0x0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      Mat::create(&local_1b8,TILE_K * TILE_N,iVar31,iVar24,1,opt->workspace_allocator);
      local_368 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
        compute_B_int8_scale(A,&B_int8_scale);
        local_168.cstep = 0;
        local_168.data = (void *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168.elemsize._4_4_ = 0;
        local_168.elempack = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        Mat::create(&local_168,uVar26,4,opt->workspace_allocator);
        local_368 = -100;
        if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
          iVar24 = iVar24 * iVar31;
          pvVar5 = (this->super_Gemm).A_data_int8_scales.data;
          uVar18 = 0;
          uVar19 = 0;
          if (0 < (int)uVar26) {
            uVar19 = (ulong)uVar26;
          }
          for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
            *(float *)((long)local_168.data + uVar18 * 4) =
                 1.0 / (*(float *)((long)pvVar5 + uVar18 * 4) * B_int8_scale);
          }
          iVar34 = 0;
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          local_330 = (ulong)uVar26;
          for (; iVar24 != iVar34; iVar34 = iVar34 + 1) {
            iVar10 = (iVar34 / iVar31) * iVar16;
            iVar21 = (int)((long)iVar34 % (long)iVar31) * TILE_K;
            iVar25 = iVar28 - iVar10;
            if (iVar16 < iVar28 - iVar10) {
              iVar25 = iVar16;
            }
            iVar11 = iVar2 - iVar21;
            if (TILE_K < iVar2 - iVar21) {
              iVar11 = TILE_K;
            }
            m_3.cstep = (size_t)local_1b8.w;
            m_3.data = (void *)((long)local_1b8.data +
                               ((long)iVar34 % (long)iVar31 & 0xffffffffU) * m_3.cstep *
                               CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                               (long)(iVar34 / iVar31) * local_1b8.cstep *
                               CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
            m_3.elemsize._4_4_ = local_1b8.elemsize._4_4_;
            m_3.elempack = local_1b8.elempack;
            m_3.allocator = local_1b8.allocator;
            m_3.dims = 2;
            m_3.w = local_1b8.w;
            m_3.h = 1;
            m_3.d = 1;
            m_3.c = 1;
            if (iVar13 == 0) {
              transpose_pack_B_tile_quantize(A,&m_3,iVar10,iVar25,iVar21,iVar11,B_int8_scale);
            }
            else {
              pack_B_tile_quantize(A,&m_3,iVar10,iVar25,iVar21,iVar11,B_int8_scale);
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,iVar16 * iVar29,1,iVar22,4,opt->workspace_allocator);
          local_368 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            local_368 = 0;
            if ((int)uVar27 < 1) {
              uVar12 = 0;
            }
            uVar27 = local_330;
            for (uVar18 = 0; uVar18 != uVar12; uVar18 = uVar18 + 1) {
              iVar13 = iVar29 * (int)uVar18;
              iVar22 = (int)uVar27 - iVar13;
              if (iVar29 < iVar22) {
                iVar22 = iVar29;
              }
              iVar24 = get_omp_thread_num();
              uVar27 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
              m.data = (void *)((long)iVar24 * m_3.cstep * uVar27 + (long)m_3.data);
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = (undefined4)m_3.elemsize;
              m.elemsize._4_4_ = m_3.elemsize._4_4_;
              m.elempack = m_3.elempack;
              m.allocator = m_3.allocator;
              m.w = m_3.w;
              m.h = m_3.h;
              m.d = 1;
              m.c = m_3.d;
              m.dims = m_3.dims + -1;
              m.cstep = (uVar27 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar27;
              if (m_3.dims == 4) {
                m.cstep = (long)m_3.h * (long)m_3.w;
              }
              for (iVar24 = 0; uVar27 = local_330, iVar31 = iVar28 - iVar24,
                  iVar31 != 0 && iVar24 <= iVar28; iVar24 = iVar24 + iVar16) {
                if (iVar16 < iVar31) {
                  iVar31 = iVar16;
                }
                iVar34 = iVar2;
                for (iVar25 = 0; iVar25 < iVar2; iVar25 = iVar25 + TILE_K) {
                  iVar10 = iVar34;
                  if (TILE_K < iVar34) {
                    iVar10 = TILE_K;
                  }
                  sVar30 = (this->AT_data).elemsize;
                  m_1.w = (this->AT_data).w;
                  m_1.cstep = (size_t)m_1.w;
                  m_1.elempack = (this->AT_data).elempack;
                  m_1.allocator = (this->AT_data).allocator;
                  m_1.data = (void *)((long)(this->AT_data).data +
                                     sVar30 * m_1.cstep * (long)(iVar25 / TILE_K) +
                                     (this->AT_data).cstep * uVar18 * sVar30);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)sVar30;
                  m_1.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
                  m_1.dims = 2;
                  m_1.h = 1;
                  m_1.d = 1;
                  m_1.c = 1;
                  m_2.cstep = (size_t)local_1b8.w;
                  m_2.elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
                  m_2.data = (void *)((long)local_1b8.data +
                                     m_2.cstep * m_2.elemsize * (long)(iVar25 / TILE_K) +
                                     (long)(iVar24 / iVar16) * local_1b8.cstep * m_2.elemsize);
                  m_2.refcount = (int *)0x0;
                  m_2.elempack = local_1b8.elempack;
                  m_2.allocator = local_1b8.allocator;
                  m_2.w = local_1b8.w;
                  m_2.h = 1;
                  m_2.d = 1;
                  m_2.dims = m_1.dims;
                  m_2.c = m_1.c;
                  gemm_transB_packed_tile_int8
                            (&m_1,&m_2,&m,iVar13,iVar22,iVar24,iVar31,iVar25,iVar10);
                  if (m_2.refcount != (int *)0x0) {
                    LOCK();
                    *m_2.refcount = *m_2.refcount + -1;
                    UNLOCK();
                    if (*m_2.refcount == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        free(m_2.data);
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar32 != (int *)0x0) {
                    LOCK();
                    *piVar32 = *piVar32 + -1;
                    UNLOCK();
                    if (*piVar32 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        free(m_1.data);
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  iVar34 = iVar34 - TILE_K;
                }
                unpack_output_tile_dequantize
                          (&m,&local_268,local_218,local_36c,iVar13,iVar22,iVar24,iVar31,&local_168,
                           (float)local_320,fVar1,(int)local_328);
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
          }
          piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                free(m_3.data);
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar32 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar32 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar32 == (int *)0x0) goto LAB_0042f7f9;
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 != 0) goto LAB_0042f7f9;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        goto LAB_0042f7f9;
      }
    }
  }
  else {
    fVar1 = (this->super_Gemm).B_data_int8_scale;
    uVar26 = (this->super_Gemm).constantM;
    iVar2 = (this->super_Gemm).constantN;
    iVar13 = (this->super_Gemm).constantK;
    local_328 = (ulong)(uint)(this->super_Gemm).output_transpose;
    local_320 = CONCAT44(local_320._4_4_,(this->super_Gemm).alpha);
    fVar17 = (this->super_Gemm).beta;
    get_optimal_tile_mnk_int8
              (uVar26,iVar2,iVar13,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,(int *)&m_2,
               &TILE_M,&TILE_N,iVar22);
    iVar28 = (int)m_2.data;
    uVar27 = (long)(int)(uVar26 + (int)m_2.data + -1) / (long)(int)m_2.data;
    uVar12 = uVar27 & 0xffffffff;
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,uVar26,4,opt->workspace_allocator);
    local_368 = -100;
    if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
      pvVar5 = (this->super_Gemm).A_data_int8_scales.data;
      uVar18 = 0;
      uVar19 = 0;
      if (0 < (int)uVar26) {
        uVar19 = (ulong)uVar26;
      }
      for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
        *(float *)((long)local_1b8.data + uVar18 * 4) =
             1.0 / (*(float *)((long)pvVar5 + uVar18 * 4) * fVar1);
      }
      iVar29 = TILE_M;
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      Mat::create(&local_168,TILE_M * iVar28,1,iVar22,4,opt->workspace_allocator);
      local_368 = -100;
      if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
        iVar22 = TILE_N;
        local_368 = 0;
        if ((int)uVar27 < 1) {
          uVar12 = 0;
        }
        local_218 = pMVar4;
        for (uVar27 = 0; uVar27 != uVar12; uVar27 = uVar27 + 1) {
          iVar24 = iVar28 * (int)uVar27;
          iVar16 = uVar26 - iVar24;
          if (iVar28 < (int)(uVar26 - iVar24)) {
            iVar16 = iVar28;
          }
          iVar31 = get_omp_thread_num();
          uVar18 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
          m_3.data = (void *)((long)iVar31 * local_168.cstep * uVar18 + (long)local_168.data);
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_168.elemsize;
          m_3.elemsize._4_4_ = local_168.elemsize._4_4_;
          m_3.elempack = local_168.elempack;
          m_3.allocator = local_168.allocator;
          m_3.w = local_168.w;
          m_3.h = local_168.h;
          m_3.d = 1;
          m_3.c = local_168.d;
          m_3.dims = local_168.dims + -1;
          m_3.cstep = (uVar18 * (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0) /
                      uVar18;
          if (local_168.dims == 4) {
            m_3.cstep = (long)local_168.h * (long)local_168.w;
          }
          for (iVar31 = 0; iVar34 = iVar2 - iVar31, iVar34 != 0 && iVar31 <= iVar2;
              iVar31 = iVar31 + iVar29) {
            if (iVar29 < iVar34) {
              iVar34 = iVar29;
            }
            iVar25 = iVar13;
            for (iVar10 = 0; iVar10 < iVar13; iVar10 = iVar10 + iVar22) {
              iVar21 = iVar25;
              if (iVar22 < iVar25) {
                iVar21 = iVar22;
              }
              sVar30 = (this->AT_data).elemsize;
              m.w = (this->AT_data).w;
              m.cstep = (size_t)m.w;
              m.elempack = (this->AT_data).elempack;
              m.allocator = (this->AT_data).allocator;
              m.data = (void *)((long)(this->AT_data).data +
                               sVar30 * m.cstep * (long)(iVar10 / iVar22) +
                               (this->AT_data).cstep * uVar27 * sVar30);
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = (undefined4)sVar30;
              m.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
              m_1.dims = 2;
              m.h = 1;
              m.d = 1;
              m_1.c = 1;
              m_1.w = (this->BT_data).w;
              m_1.cstep = (size_t)m_1.w;
              sVar30 = (this->BT_data).elemsize;
              m_1.elempack = (this->BT_data).elempack;
              m_1.data = (void *)((long)(this->BT_data).data +
                                 m_1.cstep * sVar30 * (long)(iVar10 / iVar22) +
                                 (long)(iVar31 / iVar29) * (this->BT_data).cstep * sVar30);
              m_1.allocator = (this->BT_data).allocator;
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = (undefined4)sVar30;
              m_1.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
              m_1.h = 1;
              m_1.d = 1;
              m.dims = m_1.dims;
              m.c = m_1.c;
              gemm_transB_packed_tile_int8(&m,&m_1,&m_3,iVar24,iVar16,iVar31,iVar34,iVar10,iVar21);
              piVar32 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar32 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar32 != (int *)0x0) {
                LOCK();
                *piVar32 = *piVar32 + -1;
                UNLOCK();
                if (*piVar32 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar25 = iVar25 - iVar22;
            }
            unpack_output_tile_dequantize
                      (&m_3,&local_268,local_218,local_36c,iVar24,iVar16,iVar31,iVar34,&local_1b8,
                       (float)local_320,fVar17,(int)local_328);
          }
          piVar32 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                free(m_3.data);
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
      piVar32 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar32 != (int *)0x0) {
        LOCK();
        *piVar32 = *piVar32 + -1;
        UNLOCK();
        if (*piVar32 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar32 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar32 == (int *)0x0) goto LAB_0042f7f9;
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 != 0) goto LAB_0042f7f9;
    if (local_1b8.allocator != (Allocator *)0x0) {
      (*(local_1b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0042f7f9;
    }
  }
  free(local_1b8.data);
LAB_0042f7f9:
  piVar32 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (local_268.allocator == (Allocator *)0x0) {
        free(local_268.data);
      }
      else {
        (*(local_268.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_368;
}

Assistant:

int Gemm_x86::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}